

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O1

bool peparse::getRelocations(parsed_pe *p)

{
  pointer *pprVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint16_t uVar3;
  uint uVar4;
  parsed_pe_internal *ppVar5;
  iterator __position;
  bool bVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  VA v;
  uint32_t pageRva;
  uint16_t entry;
  uint32_t blockSize;
  reloc r;
  section d;
  uint32_t local_a4;
  ushort local_9e;
  uint32_t local_9c;
  reloc local_98;
  section local_88;
  
  uVar3 = (p->peHeader).nt.OptionalMagic;
  if (uVar3 == 0x10b) {
    lVar8 = 0x124;
    lVar7 = 0x120;
  }
  else {
    if (uVar3 != 0x20b) {
      return false;
    }
    lVar8 = 0x214;
    lVar7 = 0x210;
  }
  uVar4 = *(uint *)((long)(p->peHeader).dos.e_res + lVar8 + -0x2c);
  if (uVar4 == 0) {
    return true;
  }
  uVar10 = *(uint *)((long)(p->peHeader).dos.e_res + lVar7 + -0x2c);
  paVar2 = &local_88.sectionName.field_2;
  local_88.sectionName._M_string_length = 0;
  local_88.sectionName.field_2._M_local_buf[0] = '\0';
  local_88.sectionName._M_dataplus._M_p = (pointer)paVar2;
  if (uVar3 == 0x20b) {
    v = (ulong)uVar10 + (p->peHeader).nt.OptionalHeader64.ImageBase;
LAB_001174dd:
    bVar6 = getSecForVA(&p->internal->secs,v,&local_88);
    if (bVar6) {
      uVar10 = (int)v - (int)local_88.sectionBase;
      do {
        if (uVar4 <= uVar10) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88.sectionName._M_dataplus._M_p != &local_88.sectionName.field_2) {
            operator_delete(local_88.sectionName._M_dataplus._M_p,
                            CONCAT71(local_88.sectionName.field_2._M_allocated_capacity._1_7_,
                                     local_88.sectionName.field_2._M_local_buf[0]) + 1);
            return true;
          }
          return true;
        }
        bVar6 = readDword(local_88.sectionData,uVar10,&local_a4);
        if ((bVar6) && (bVar6 = readDword(local_88.sectionData,uVar10 + 4,&local_9c), bVar6)) {
          uVar9 = local_9c - 8 >> 1;
          uVar10 = uVar10 + 8;
          do {
            bVar6 = uVar9 == 0;
            if (bVar6) goto LAB_00117608;
            bVar6 = readWord(local_88.sectionData,uVar10,&local_9e);
            if (bVar6) {
              uVar3 = (p->peHeader).nt.OptionalMagic;
              if (uVar3 == 0x20b) {
                local_98.shiftedAddr =
                     (ulong)((local_9e & 0xfff) + local_a4) +
                     (p->peHeader).nt.OptionalHeader64.ImageBase;
              }
              else {
                if (uVar3 != 0x10b) goto LAB_001175a3;
                local_98.shiftedAddr =
                     (VA)((local_9e & 0xfff) + local_a4 + (p->peHeader).nt.OptionalHeader.ImageBase)
                ;
              }
              local_98.type = (reloc_type)(local_9e >> 0xc);
              ppVar5 = p->internal;
              __position._M_current =
                   (ppVar5->relocs).
                   super__Vector_base<peparse::reloc,_std::allocator<peparse::reloc>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (ppVar5->relocs).
                  super__Vector_base<peparse::reloc,_std::allocator<peparse::reloc>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<peparse::reloc,std::allocator<peparse::reloc>>::
                _M_realloc_insert<peparse::reloc_const&>
                          ((vector<peparse::reloc,std::allocator<peparse::reloc>> *)&ppVar5->relocs,
                           __position,&local_98);
              }
              else {
                (__position._M_current)->shiftedAddr = local_98.shiftedAddr;
                *(ulong *)&(__position._M_current)->type = CONCAT44(local_98._12_4_,local_98.type);
                pprVar1 = &(ppVar5->relocs).
                           super__Vector_base<peparse::reloc,_std::allocator<peparse::reloc>_>.
                           _M_impl.super__Vector_impl_data._M_finish;
                *pprVar1 = *pprVar1 + 1;
              }
              uVar9 = uVar9 - 1;
              uVar10 = uVar10 + 2;
              bVar6 = true;
            }
            else {
LAB_001175a3:
              bVar6 = false;
            }
          } while (bVar6);
          bVar6 = false;
        }
        else {
          bVar6 = false;
        }
LAB_00117608:
      } while (bVar6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88.sectionName._M_dataplus._M_p == &local_88.sectionName.field_2) {
        return false;
      }
      goto LAB_0011762b;
    }
  }
  else if (uVar3 == 0x10b) {
    v = (VA)(uVar10 + (p->peHeader).nt.OptionalHeader.ImageBase);
    goto LAB_001174dd;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.sectionName._M_dataplus._M_p == paVar2) {
    return false;
  }
LAB_0011762b:
  operator_delete(local_88.sectionName._M_dataplus._M_p,
                  CONCAT71(local_88.sectionName.field_2._M_allocated_capacity._1_7_,
                           local_88.sectionName.field_2._M_local_buf[0]) + 1);
  return false;
}

Assistant:

bool getRelocations(parsed_pe *p) {
  data_directory relocDir;
  if (p->peHeader.nt.OptionalMagic == NT_OPTIONAL_32_MAGIC) {
    relocDir = p->peHeader.nt.OptionalHeader.DataDirectory[DIR_BASERELOC];
  } else if (p->peHeader.nt.OptionalMagic == NT_OPTIONAL_64_MAGIC) {
    relocDir = p->peHeader.nt.OptionalHeader64.DataDirectory[DIR_BASERELOC];
  } else {
    return false;
  }

  if (relocDir.Size != 0) {
    section d;
    VA vaAddr;
    if (p->peHeader.nt.OptionalMagic == NT_OPTIONAL_32_MAGIC) {
      vaAddr =
          relocDir.VirtualAddress + p->peHeader.nt.OptionalHeader.ImageBase;
    } else if (p->peHeader.nt.OptionalMagic == NT_OPTIONAL_64_MAGIC) {
      vaAddr =
          relocDir.VirtualAddress + p->peHeader.nt.OptionalHeader64.ImageBase;
    } else {
      return false;
    }

    if (!getSecForVA(p->internal->secs, vaAddr, d)) {
      return false;
    }

    auto rvaofft = static_cast<std::uint32_t>(vaAddr - d.sectionBase);

    while (rvaofft < relocDir.Size) {
      std::uint32_t pageRva;
      std::uint32_t blockSize;

      if (!readDword(d.sectionData,
                     rvaofft + offsetof(reloc_block, PageRVA),
                     pageRva)) {
        return false;
      }

      if (!readDword(d.sectionData,
                     rvaofft + offsetof(reloc_block, BlockSize),
                     blockSize)) {
        return false;
      }

      // BlockSize - The total number of bytes in the base relocation block,
      // including the Page RVA and Block Size fields and the Type/Offset fields
      // that follow. Therefore we should subtract 8 bytes from BlockSize to
      // exclude the Page RVA and Block Size fields.
      std::uint32_t entryCount = (blockSize - 8) / sizeof(std::uint16_t);

      // Skip the Page RVA and Block Size fields
      rvaofft += sizeof(reloc_block);

      // Iterate over all of the block Type/Offset entries
      while (entryCount != 0) {
        std::uint16_t entry;
        std::uint8_t type;
        std::uint16_t offset;

        if (!readWord(d.sectionData, rvaofft, entry)) {
          return false;
        }

        // Mask out the type and assign
        type = entry >> 12;
        // Mask out the offset and assign
        offset = entry & static_cast<std::uint16_t>(~0xf000);

        // Produce the VA of the relocation
        VA relocVA;
        if (p->peHeader.nt.OptionalMagic == NT_OPTIONAL_32_MAGIC) {
          relocVA = pageRva + offset + p->peHeader.nt.OptionalHeader.ImageBase;
        } else if (p->peHeader.nt.OptionalMagic == NT_OPTIONAL_64_MAGIC) {
          relocVA =
              pageRva + offset + p->peHeader.nt.OptionalHeader64.ImageBase;
        } else {
          return false;
        }

        // Store in our list
        reloc r;

        r.shiftedAddr = relocVA;
        r.type = static_cast<reloc_type>(type);
        p->internal->relocs.push_back(r);

        entryCount--;
        rvaofft += sizeof(std::uint16_t);
      }
    }
  }

  return true;
}